

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Cues::~Cues(Cues *this)

{
  CuePoint **ppCVar1;
  CuePoint *this_00;
  int32_t i;
  long lVar2;
  
  if (this->cue_entries_ != (CuePoint **)0x0) {
    for (lVar2 = 0; ppCVar1 = this->cue_entries_, lVar2 < this->cue_entries_size_; lVar2 = lVar2 + 1
        ) {
      this_00 = ppCVar1[lVar2];
      if (this_00 != (CuePoint *)0x0) {
        CuePoint::~CuePoint(this_00);
      }
      operator_delete(this_00);
    }
    if (ppCVar1 != (CuePoint **)0x0) {
      operator_delete__(ppCVar1);
      return;
    }
  }
  return;
}

Assistant:

Cues::~Cues() {
  if (cue_entries_) {
    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      CuePoint* const cue = cue_entries_[i];
      delete cue;
    }
    delete[] cue_entries_;
  }
}